

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingParameters.hpp
# Opt level: O2

Vector3f __thiscall eos::fitting::RenderingParameters::get_yaw_pitch_roll(RenderingParameters *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Matrix<float,_3,_1,_0,_3,_1> MVar3;
  Vector3f VVar4;
  MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> aMStack_58 [28];
  undefined1 local_3c [36];
  
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::normalized(aMStack_58);
  Eigen::QuaternionBase<Eigen::Quaternion<float,_0>_>::toRotationMatrix
            ((QuaternionBase<Eigen::Quaternion<float,_0>_> *)aMStack_58);
  MVar3 = tait_bryan_angles<float>((Matrix<float,_3,_3,_0,_3,_3> *)this,(Index)local_3c,1,0);
  VVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       MVar3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  uVar1 = this->camera_type;
  uVar2 = (this->frustum).l;
  this->camera_type = (CameraType)((float)uVar1 * 57.29578);
  (this->frustum).l = (float)uVar2 * 57.29578;
  VVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (this->frustum).r * 57.29578;
  VVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0;
  (this->frustum).r =
       VVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  return (Vector3f)
         VVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array;
}

Assistant:

Eigen::Vector3f get_yaw_pitch_roll()
    {
        // We use Eigen's Matrix3::eulerAngles() function with axes (1, 0, 2). In our coordinate system, the x
        // axis is to the right, y up, and z into/out of the screen. So to get yaw first, our first axis is y
        // ('1'), then our x axis ('0') to get pitch, then our z axis ('2') to get roll.
        // We are guessing that the function returns intrinsic angles (the unsupported EulerAngles() module
        // does, but it's an unrelated module).
        // Because eulerAngles() constrains the angles in a different way to what we want, we correct for
        // that in tait_bryan_angles() (which calls eulerAngles() and then modifies the solution accordingly).
        Eigen::Vector3f ea = fitting::tait_bryan_angles(rotation.normalized().toRotationMatrix(), 1, 0, 2);
        ea(0) = core::degrees(ea(0));
        ea(1) = core::degrees(ea(1));
        ea(2) = core::degrees(ea(2));
        return ea;
    }